

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateMergeFromCodedStream
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  int iVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *pFVar3;
  uint32 uVar4;
  FieldDescriptor **ppFVar5;
  FieldGenerator *pFVar6;
  ulong uVar7;
  long lVar8;
  Descriptor *pDVar9;
  int i;
  uint i_00;
  uint i_01;
  uint i_02;
  uint extraout_EDX;
  uint i_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *pcVar11;
  protobuf *this_00;
  long lVar12;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  scoped_array<const_google::protobuf::FieldDescriptor_*> ordered_fields;
  undefined8 uVar10;
  
  value = &this->classname_;
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) == '\x01') {
    io::Printer::Print(printer,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                       ,"classname",value);
    pFVar2 = *(FileDescriptor **)(this->descriptor_ + 0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)&ordered_fields);
    PrintHandlingOptionalStaticInitializers
              (pFVar2,printer,
               "  return _extensions_.ParseMessageSet(input, default_instance_,\n                                      mutable_unknown_fields());\n"
               ,
               "  return _extensions_.ParseMessageSet(input, &default_instance(),\n                                      mutable_unknown_fields());\n"
               ,"classname",value,(char *)0x0,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pcVar11 = "}\n";
  }
  else {
    io::Printer::Print(printer,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n#define DO_(EXPRESSION) if (!(EXPRESSION)) return false\n  ::google::protobuf::uint32 tag;\n  while ((tag = input->ReadTag()) != 0) {\n"
                       ,"classname",value);
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    if (0 < *(int *)(this->descriptor_ + 0x2c)) {
      io::Printer::Print(printer,
                         "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n"
                        );
      io::Printer::Indent(printer);
      ordered_fields.array_ = anon_unknown_0::SortFieldsByNumber(this->descriptor_);
      for (lVar12 = 1; lVar12 + -1 < (long)*(int *)(this->descriptor_ + 0x2c); lVar12 = lVar12 + 1)
      {
        ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&ordered_fields,lVar12 + -1);
        pFVar3 = *ppFVar5;
        anon_unknown_0::PrintFieldComment(printer,pFVar3);
        SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(ulong)*(uint *)(pFVar3 + 0x28),i);
        io::Printer::Print(printer,"case $number$: {\n","number",&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        io::Printer::Indent(printer);
        pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar3);
        uVar7 = 2;
        if (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\0') {
          uVar7 = (ulong)*(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                  (ulong)*(uint *)(pFVar3 + 0x2c) * 4);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,*(char **)((anonymous_namespace)::kWireTypeNames + uVar7 * 8)
                   ,&local_7a);
        io::Printer::Print(printer,
                           "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_$wiretype$) {\n"
                           ,"wiretype",&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        if ((lVar12 != 1) ||
           ((*(int *)(pFVar3 + 0x30) == 3 && (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\0'))))
        {
          io::Printer::Print(printer," parse_$name$:\n","name",*(string **)pFVar3);
        }
        io::Printer::Indent(printer);
        (*pFVar6->_vptr_FieldGenerator[(ulong)*(byte *)(*(long *)(pFVar3 + 0x60) + 0x44) + 0xd])
                  (pFVar6,printer);
        io::Printer::Outdent(printer);
        if (*(uint *)(pFVar3 + 0x2c) - 0xd < 0xfffffffc && *(int *)(pFVar3 + 0x30) == 3) {
          if (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\x01') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,
                       *(char **)((anonymous_namespace)::kWireTypeNames +
                                 (ulong)*(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                                 (ulong)*(uint *)(pFVar3 + 0x2c) * 4) * 8),&local_7a
                      );
            io::Printer::Print(printer,
                               "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n           == ::google::protobuf::internal::WireFormatLite::\n              WIRETYPE_$wiretype$) {\n"
                               ,"wiretype",&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            io::Printer::Indent(printer);
            lVar8 = 0x68;
          }
          else {
            io::Printer::Print(printer,
                               "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n           == ::google::protobuf::internal::WireFormatLite::\n              WIRETYPE_LENGTH_DELIMITED) {\n"
                              );
            io::Printer::Indent(printer);
            lVar8 = 0x70;
          }
          (**(code **)((long)pFVar6->_vptr_FieldGenerator + lVar8))(pFVar6,printer);
          io::Printer::Outdent(printer);
        }
        io::Printer::Print(printer,"} else {\n  goto handle_uninterpreted;\n}\n");
        if ((*(int *)(pFVar3 + 0x30) == 3) && (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\0'))
        {
          uVar4 = internal::WireFormat::MakeTag(pFVar3);
          SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(ulong)uVar4,i_00);
          io::Printer::Print(printer,"if (input->ExpectTag($tag$)) goto parse_$name$;\n","tag",
                             &local_78,"name",*(string **)pFVar3);
          std::__cxx11::string::~string((string *)&local_78);
        }
        if ((int)lVar12 < *(int *)(this->descriptor_ + 0x2c)) {
          ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              (&ordered_fields,lVar12);
          pFVar3 = *ppFVar5;
          uVar4 = internal::WireFormat::MakeTag(pFVar3);
          SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(ulong)uVar4,i_01);
          io::Printer::Print(printer,"if (input->ExpectTag($next_tag$)) goto parse_$next_name$;\n",
                             "next_tag",&local_78,"next_name",*(string **)pFVar3);
          std::__cxx11::string::~string((string *)&local_78);
        }
        else {
          io::Printer::Print(printer,"if (input->ExpectAtEnd()) return true;\n");
        }
        io::Printer::Print(printer,"break;\n");
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n\n");
      }
      io::Printer::Print(printer,"default: {\nhandle_uninterpreted:\n");
      io::Printer::Indent(printer);
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
                (&ordered_fields);
    }
    io::Printer::Print(printer,
                       "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n  return true;\n}\n"
                      );
    pDVar9 = this->descriptor_;
    if (0 < *(int *)(pDVar9 + 0x58)) {
      io::Printer::Print(printer,"if (");
      lVar12 = 0;
      uVar10 = extraout_RDX;
      while( true ) {
        i_02 = (uint)uVar10;
        if (*(int *)(this->descriptor_ + 0x58) <= lVar12) break;
        lVar8 = *(long *)(this->descriptor_ + 0x60);
        if (lVar12 != 0) {
          io::Printer::Print(printer," ||\n    ");
          i_02 = extraout_EDX;
        }
        iVar1 = *(int *)(lVar8 + 4 + lVar12 * 8);
        this_00 = (protobuf *)(ulong)(uint)(*(int *)(lVar8 + lVar12 * 8) << 3);
        if (iVar1 < 0x20000000) {
          SimpleItoa_abi_cxx11_(&local_78,this_00,i_02);
          SimpleItoa_abi_cxx11_
                    ((string *)&ordered_fields,(protobuf *)(ulong)(uint)(iVar1 << 3),i_03);
          io::Printer::Print(printer,"($start$u <= tag && tag < $end$u)","start",&local_78,"end",
                             (string *)&ordered_fields);
          std::__cxx11::string::~string((string *)&ordered_fields);
        }
        else {
          SimpleItoa_abi_cxx11_(&local_78,this_00,i_02);
          io::Printer::Print(printer,"($start$u <= tag)","start",&local_78);
        }
        std::__cxx11::string::~string((string *)&local_78);
        lVar12 = lVar12 + 1;
        uVar10 = extraout_RDX_00;
      }
      io::Printer::Print(printer,") {\n");
      pFVar2 = *(FileDescriptor **)(this->descriptor_ + 0x10);
      if (*(int *)(*(long *)(pFVar2 + 0x88) + 0x50) == 3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_7a);
        std::__cxx11::string::string<std::allocator<char>>((string *)&ordered_fields,"",&local_79);
        PrintHandlingOptionalStaticInitializers
                  (pFVar2,printer,"  DO_(_extensions_.ParseField(tag, input, default_instance_));\n"
                   ,"  DO_(_extensions_.ParseField(tag, input, &default_instance()));\n",(char *)0x0
                   ,&local_78,(char *)0x0,(string *)&ordered_fields);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_7a);
        std::__cxx11::string::string<std::allocator<char>>((string *)&ordered_fields,"",&local_79);
        PrintHandlingOptionalStaticInitializers
                  (pFVar2,printer,
                   "  DO_(_extensions_.ParseField(tag, input, default_instance_,\n                              mutable_unknown_fields()));\n"
                   ,
                   "  DO_(_extensions_.ParseField(tag, input, &default_instance(),\n                              mutable_unknown_fields()));\n"
                   ,(char *)0x0,&local_78,(char *)0x0,(string *)&ordered_fields);
      }
      std::__cxx11::string::~string((string *)&ordered_fields);
      std::__cxx11::string::~string((string *)&local_78);
      io::Printer::Print(printer,"  continue;\n}\n");
      pDVar9 = this->descriptor_;
    }
    pcVar11 = 
    "DO_(::google::protobuf::internal::WireFormat::SkipField(\n      input, tag, mutable_unknown_fields()));\n"
    ;
    if (*(int *)(*(long *)(*(long *)(pDVar9 + 0x10) + 0x88) + 0x50) == 3) {
      pcVar11 = "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n";
    }
    io::Printer::Print(printer,pcVar11);
    if (0 < *(int *)(this->descriptor_ + 0x2c)) {
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    pcVar11 = "  }\n  return true;\n#undef DO_\n}\n";
  }
  io::Printer::Print(printer,pcVar11);
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "bool $classname$::MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input) {\n",
      "classname", classname_);

    PrintHandlingOptionalStaticInitializers(
      descriptor_->file(), printer,
      // With static initializers.
      "  return _extensions_.ParseMessageSet(input, default_instance_,\n"
      "                                      mutable_unknown_fields());\n",
      // Without.
      "  return _extensions_.ParseMessageSet(input, &default_instance(),\n"
      "                                      mutable_unknown_fields());\n",
      // Vars.
      "classname", classname_);

    printer->Print(
      "}\n");
    return;
  }

  printer->Print(
    "bool $classname$::MergePartialFromCodedStream(\n"
    "    ::google::protobuf::io::CodedInputStream* input) {\n"
    "#define DO_(EXPRESSION) if (!(EXPRESSION)) return false\n"
    "  ::google::protobuf::uint32 tag;\n"
    "  while ((tag = input->ReadTag()) != 0) {\n",
    "classname", classname_);

  printer->Indent();
  printer->Indent();

  if (descriptor_->field_count() > 0) {
    // We don't even want to print the switch() if we have no fields because
    // MSVC dislikes switch() statements that contain only a default value.

    // Note:  If we just switched on the tag rather than the field number, we
    // could avoid the need for the if() to check the wire type at the beginning
    // of each case.  However, this is actually a bit slower in practice as it
    // creates a jump table that is 8x larger and sparser, and meanwhile the
    // if()s are highly predictable.
    printer->Print(
      "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n");

    printer->Indent();

    scoped_array<const FieldDescriptor*> ordered_fields(
      SortFieldsByNumber(descriptor_));

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = ordered_fields[i];

      PrintFieldComment(printer, field);

      printer->Print(
        "case $number$: {\n",
        "number", SimpleItoa(field->number()));
      printer->Indent();
      const FieldGenerator& field_generator = field_generators_.get(field);

      // Emit code to parse the common, expected case.
      printer->Print(
        "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
        "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_$wiretype$) {\n",
        "wiretype", kWireTypeNames[WireFormat::WireTypeForField(field)]);

      if (i > 0 || (field->is_repeated() && !field->options().packed())) {
        printer->Print(
          " parse_$name$:\n",
          "name", field->name());
      }

      printer->Indent();
      if (field->options().packed()) {
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
      } else {
        field_generator.GenerateMergeFromCodedStream(printer);
      }
      printer->Outdent();

      // Emit code to parse unexpectedly packed or unpacked values.
      if (field->is_packable() && field->options().packed()) {
        printer->Print(
          "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n"
          "           == ::google::protobuf::internal::WireFormatLite::\n"
          "              WIRETYPE_$wiretype$) {\n",
          "wiretype",
          kWireTypeNames[WireFormat::WireTypeForFieldType(field->type())]);
        printer->Indent();
        field_generator.GenerateMergeFromCodedStream(printer);
        printer->Outdent();
      } else if (field->is_packable() && !field->options().packed()) {
        printer->Print(
          "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n"
          "           == ::google::protobuf::internal::WireFormatLite::\n"
          "              WIRETYPE_LENGTH_DELIMITED) {\n");
        printer->Indent();
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
        printer->Outdent();
      }

      printer->Print(
        "} else {\n"
        "  goto handle_uninterpreted;\n"
        "}\n");

      // switch() is slow since it can't be predicted well.  Insert some if()s
      // here that attempt to predict the next tag.
      if (field->is_repeated() && !field->options().packed()) {
        // Expect repeats of this field.
        printer->Print(
          "if (input->ExpectTag($tag$)) goto parse_$name$;\n",
          "tag", SimpleItoa(WireFormat::MakeTag(field)),
          "name", field->name());
      }

      if (i + 1 < descriptor_->field_count()) {
        // Expect the next field in order.
        const FieldDescriptor* next_field = ordered_fields[i + 1];
        printer->Print(
          "if (input->ExpectTag($next_tag$)) goto parse_$next_name$;\n",
          "next_tag", SimpleItoa(WireFormat::MakeTag(next_field)),
          "next_name", next_field->name());
      } else {
        // Expect EOF.
        // TODO(kenton):  Expect group end-tag?
        printer->Print(
          "if (input->ExpectAtEnd()) return true;\n");
      }

      printer->Print(
        "break;\n");

      printer->Outdent();
      printer->Print("}\n\n");
    }

    printer->Print(
      "default: {\n"
      "handle_uninterpreted:\n");
    printer->Indent();
  }

  // Is this an end-group tag?  If so, this must be the end of the message.
  printer->Print(
    "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
    "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n"
    "  return true;\n"
    "}\n");

  // Handle extension ranges.
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (");
    for (int i = 0; i < descriptor_->extension_range_count(); i++) {
      const Descriptor::ExtensionRange* range =
        descriptor_->extension_range(i);
      if (i > 0) printer->Print(" ||\n    ");

      uint32 start_tag = WireFormatLite::MakeTag(
        range->start, static_cast<WireFormatLite::WireType>(0));
      uint32 end_tag = WireFormatLite::MakeTag(
        range->end, static_cast<WireFormatLite::WireType>(0));

      if (range->end > FieldDescriptor::kMaxNumber) {
        printer->Print(
          "($start$u <= tag)",
          "start", SimpleItoa(start_tag));
      } else {
        printer->Print(
          "($start$u <= tag && tag < $end$u)",
          "start", SimpleItoa(start_tag),
          "end", SimpleItoa(end_tag));
      }
    }
    printer->Print(") {\n");
    if (HasUnknownFields(descriptor_->file())) {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  DO_(_extensions_.ParseField(tag, input, default_instance_,\n"
        "                              mutable_unknown_fields()));\n",
        // Without.
        "  DO_(_extensions_.ParseField(tag, input, &default_instance(),\n"
        "                              mutable_unknown_fields()));\n");
    } else {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  DO_(_extensions_.ParseField(tag, input, default_instance_));\n",
        // Without.
        "  DO_(_extensions_.ParseField(tag, input, &default_instance()));\n");
    }
    printer->Print(
      "  continue;\n"
      "}\n");
  }

  // We really don't recognize this tag.  Skip it.
  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormat::SkipField(\n"
      "      input, tag, mutable_unknown_fields()));\n");
  } else {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n");
  }

  if (descriptor_->field_count() > 0) {
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");    // default:
    printer->Outdent();
    printer->Print("}\n");    // switch
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "  }\n"                   // while
    "  return true;\n"
    "#undef DO_\n"
    "}\n");
}